

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_container_intersection
               (array_container_t *array1,array_container_t *array2,array_container_t *out)

{
  int b;
  _Bool _Var1;
  int32_t iVar2;
  int32_t iVar3;
  int threshold;
  int32_t min_card;
  int32_t card_2;
  int32_t card_1;
  array_container_t *out_local;
  array_container_t *array2_local;
  array_container_t *array1_local;
  
  iVar3 = array1->cardinality;
  b = array2->cardinality;
  iVar2 = minimum_int32(iVar3,b);
  if (out->capacity < iVar2) {
    array_container_grow(out,iVar2 + 8,false);
  }
  if (iVar3 * 0x40 < b) {
    iVar3 = intersect_skewed_uint16(array1->array,(long)iVar3,array2->array,(long)b,out->array);
    out->cardinality = iVar3;
  }
  else if (b * 0x40 < iVar3) {
    iVar3 = intersect_skewed_uint16(array2->array,(long)b,array1->array,(long)iVar3,out->array);
    out->cardinality = iVar3;
  }
  else {
    _Var1 = croaring_avx2();
    if (_Var1) {
      iVar3 = intersect_vector16(array1->array,(long)iVar3,array2->array,(long)b,out->array);
      out->cardinality = iVar3;
    }
    else {
      iVar3 = intersect_uint16(array1->array,(long)iVar3,array2->array,(long)b,out->array);
      out->cardinality = iVar3;
    }
  }
  return;
}

Assistant:

void array_container_intersection(const array_container_t *array1,
                                  const array_container_t *array2,
                                  array_container_t *out) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality,
            min_card = minimum_int32(card_1, card_2);
    const int threshold = 64;  // subject to tuning
#ifdef CROARING_IS_X64
    if (out->capacity < min_card) {
      array_container_grow(out, min_card + sizeof(__m128i) / sizeof(uint16_t),
        false);
    }
#else
    if (out->capacity < min_card) {
      array_container_grow(out, min_card, false);
    }
#endif

    if (card_1 * threshold < card_2) {
        out->cardinality = intersect_skewed_uint16(
            array1->array, card_1, array2->array, card_2, out->array);
    } else if (card_2 * threshold < card_1) {
        out->cardinality = intersect_skewed_uint16(
            array2->array, card_2, array1->array, card_1, out->array);
    } else {
#ifdef CROARING_IS_X64
       if( croaring_avx2() ) {
        out->cardinality = intersect_vector16(
            array1->array, card_1, array2->array, card_2, out->array);
       } else {
        out->cardinality = intersect_uint16(array1->array, card_1,
                                            array2->array, card_2, out->array);
       }
#else
        out->cardinality = intersect_uint16(array1->array, card_1,
                                            array2->array, card_2, out->array);
#endif
    }
}